

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_68f06::IntrusiveListTest::AssertListEq
          (IntrusiveListTest *this,TestObjectList *list,vector<int,_std::allocator<int>_> *expected)

{
  int line;
  long lVar1;
  _func_int **pp_Var2;
  char *message;
  pointer *__ptr;
  AssertionResult gtest_ar;
  size_t count;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  pp_Var2 = (this->super_Test)._vptr_Test;
  if (pp_Var2 != (_func_int **)0x0) {
    do {
      lVar1 = local_40 * 4;
      local_40 = local_40 + 1;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"expected[count++]","node.data",
                 (int *)((long)&(list->first_->
                                super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_
                        + lVar1),(int *)(pp_Var2 + 2));
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_50->_M_dataplus)._M_p;
        }
        line = 0x58;
        goto LAB_0014ae32;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      pp_Var2 = (_func_int **)*pp_Var2;
    } while (pp_Var2 != (_func_int **)0x0);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)list->last_ - (long)list->first_ >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"count","expected.size()",&local_40,(unsigned_long *)&local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    line = 0x5a;
LAB_0014ae32:
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

void AssertListEq(const TestObjectList& list,
                    const std::vector<int>& expected) {
    size_t count = 0;
    for (const TestObject& node : list) {
      ASSERT_EQ(expected[count++], node.data);
    }
    ASSERT_EQ(count, expected.size());
  }